

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<_7648aab9_> * __thiscall
llvm::SmallVectorImpl<$7648aab9$>::operator=
          (SmallVectorImpl<_7648aab9_> *this,SmallVectorImpl<_7648aab9_> *RHS)

{
  Unparsed *__first;
  Unparsed *pUVar1;
  Unparsed *pUVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  Unparsed *__cur;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  Unparsed *__result;
  
  if (this == RHS) {
    return this;
  }
  __first = (Unparsed *)
            (RHS->super_SmallVectorTemplateBase<_5635df56_>).
            super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX;
  pUVar1 = (Unparsed *)
           (RHS->super_SmallVectorTemplateBase<_5635df56_>).
           super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX;
  uVar9 = (long)pUVar1 - (long)__first;
  __result = (Unparsed *)
             (this->super_SmallVectorTemplateBase<_5635df56_>).
             super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX;
  pUVar2 = (Unparsed *)
           (this->super_SmallVectorTemplateBase<_5635df56_>).
           super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX;
  lVar8 = (long)pUVar2 - (long)__result;
  uVar5 = lVar8 / 0x18;
  if ((ulong)((long)uVar9 / 0x18) <= uVar5) {
    if (pUVar1 != __first) {
      __result = std::__copy_move<false,_false,_std::random_access_iterator_tag>::
                 __copy_m<_62f1e89b_>(__first,(Unparsed *)(uVar9 + (long)__first),__result);
    }
    goto LAB_00a5a1ff;
  }
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                    super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.CapacityX -
             (long)__result) < uVar9) {
    (this->super_SmallVectorTemplateBase<_5635df56_>).super_SmallVectorTemplateCommon<_b117901_>.
    super_SmallVectorBase.EndX = __result;
    SmallVectorTemplateBase<$5635df56$>::grow
              (&this->super_SmallVectorTemplateBase<_5635df56_>,(long)uVar9 / 0x18);
LAB_00a5a1c8:
    uVar5 = 0;
  }
  else {
    if (pUVar2 == __result) goto LAB_00a5a1c8;
    std::__copy_move<false,_false,_std::random_access_iterator_tag>::__copy_m<_62f1e89b_>
              (__first,(Unparsed *)(lVar8 + (long)__first),__result);
  }
  puVar3 = (undefined8 *)
           (RHS->super_SmallVectorTemplateBase<_5635df56_>).
           super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX;
  puVar6 = (undefined8 *)
           (uVar5 * 0x18 +
           (long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                 super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX);
  for (puVar7 = (undefined8 *)
                ((long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                       super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX +
                uVar5 * 0x18); puVar7 != puVar3; puVar7 = puVar7 + 3) {
    puVar6[2] = puVar7[2];
    uVar4 = puVar7[1];
    *puVar6 = *puVar7;
    puVar6[1] = uVar4;
    puVar6 = puVar6 + 3;
  }
  __result = (Unparsed *)
             (uVar9 + (long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                            super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX)
  ;
LAB_00a5a1ff:
  (this->super_SmallVectorTemplateBase<_5635df56_>).super_SmallVectorTemplateCommon<_b117901_>.
  super_SmallVectorBase.EndX = __result;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}